

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  long lVar1;
  byte bVar2;
  int a_00;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  char *pcVar9;
  void *__ptr;
  byte *pbVar10;
  long lVar11;
  byte bVar12;
  stbi__uint32 sVar13;
  uint uVar14;
  size_t __n;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  size_t __n_00;
  uint uVar22;
  ushort *puVar23;
  char cVar24;
  uint uVar25;
  byte *__src;
  ulong uVar26;
  ushort *src;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  bool bVar31;
  
  bVar31 = depth == 0x10;
  iVar6 = x * out_n << bVar31;
  a_00 = a->s->img_n;
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return 0;
  }
  iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar7 != 0) {
    uVar27 = a_00 * x;
    uVar25 = uVar27 * depth + 7 >> 3;
    if ((int)y < 0) {
      bVar30 = true;
    }
    else if (y == 0) {
      bVar30 = false;
    }
    else {
      bVar30 = (uint)(0x7fffffff / (ulong)y) < uVar25;
    }
    if ((!bVar30) && ((int)(uVar25 * y) <= (int)(uVar25 ^ 0x7fffffff))) {
      if (raw_len < (uVar25 + 1) * y) {
        pcVar9 = "not enough pixels";
      }
      else {
        __ptr = malloc((ulong)(uVar25 * 2));
        if (__ptr != (void *)0x0) {
          uVar14 = 1;
          uVar3 = a_00 << bVar31;
          if (depth < 8) {
            uVar3 = 1;
          }
          if (y != 0) {
            sVar13 = x;
            if (depth < 8) {
              sVar13 = uVar25;
            }
            uVar14 = sVar13 * uVar3;
            __n_00 = (size_t)(int)uVar3;
            __n = (size_t)(int)uVar14;
            lVar1 = __n_00 + 1;
            bVar5 = 1;
            bVar20 = 1;
            uVar28 = 0;
            uVar26 = 0;
            do {
              uVar17 = 0;
              if ((uVar26 & 1) != 0) {
                uVar17 = (ulong)uVar25;
              }
              uVar29 = (ulong)uVar28;
              __src = raw + 1;
              bVar2 = *raw;
              uVar16 = (ulong)bVar2;
              if (uVar16 < 5) {
                if (uVar26 == 0) {
                  uVar16 = (ulong)""[uVar16];
                }
                src = (ushort *)(uVar17 + (long)__ptr);
                psVar8 = a->out;
                if ((byte)uVar16 < 6) {
                  uVar17 = (ulong)((bVar20 & 1) * uVar25);
                  pbVar10 = (byte *)((long)__ptr + uVar17);
                  switch(uVar16) {
                  case 0:
                    memcpy(src,__src,__n);
                    break;
                  case 1:
                    memcpy(src,__src,__n_00);
                    if ((int)uVar3 < (int)uVar14) {
                      lVar11 = 0;
                      do {
                        *(byte *)((long)src + lVar11 + __n_00) =
                             *(byte *)((long)src + lVar11) + raw[lVar11 + lVar1];
                        lVar11 = lVar11 + 1;
                      } while ((__n_00 - __n) + lVar11 != 0);
                    }
                    break;
                  case 2:
                    if (0 < (int)uVar14) {
                      uVar17 = 0;
                      do {
                        *(byte *)((long)src + uVar17) = pbVar10[uVar17] + __src[uVar17];
                        uVar17 = uVar17 + 1;
                      } while (uVar14 != uVar17);
                    }
                    break;
                  case 3:
                    if (0 < (int)uVar3) {
                      uVar16 = 0;
                      do {
                        *(byte *)((long)src + uVar16) = (pbVar10[uVar16] >> 1) + __src[uVar16];
                        uVar16 = uVar16 + 1;
                      } while (uVar3 != uVar16);
                    }
                    if ((int)uVar3 < (int)uVar14) {
                      pbVar10 = (byte *)((long)__ptr + uVar17 + __n_00);
                      pbVar18 = raw + lVar1;
                      sVar15 = __n;
                      puVar23 = src;
                      do {
                        *(byte *)((long)puVar23 + __n_00) =
                             (char)((uint)(byte)*puVar23 + (uint)*pbVar10 >> 1) + *pbVar18;
                        puVar23 = (ushort *)((long)puVar23 + 1);
                        pbVar18 = pbVar18 + 1;
                        pbVar10 = pbVar10 + 1;
                        sVar15 = sVar15 - 1;
                      } while (__n_00 != sVar15);
                    }
                    break;
                  case 4:
                    if (0 < (int)uVar3) {
                      uVar17 = 0;
                      do {
                        *(byte *)((long)src + uVar17) = pbVar10[uVar17] + __src[uVar17];
                        uVar17 = uVar17 + 1;
                      } while (uVar3 != uVar17);
                    }
                    if ((int)uVar3 < (int)uVar14) {
                      pbVar18 = raw + lVar1;
                      sVar15 = __n;
                      puVar23 = src;
                      do {
                        bVar12 = (byte)*puVar23;
                        bVar19 = *pbVar10;
                        uVar21 = (uint)bVar12;
                        iVar7 = (((uint)bVar19 + (uint)bVar19 * 2) - (uint)pbVar10[__n_00]) - uVar21
                        ;
                        uVar22 = (uint)pbVar10[__n_00];
                        uVar4 = uVar22;
                        if (uVar21 < uVar22) {
                          uVar4 = (uint)bVar12;
                        }
                        if (uVar22 < uVar21) {
                          uVar22 = (uint)bVar12;
                        }
                        uVar21 = (uint)bVar19;
                        if ((int)uVar22 <= iVar7) {
                          uVar21 = uVar4;
                        }
                        cVar24 = (char)uVar21;
                        if (iVar7 <= (int)uVar4) {
                          cVar24 = (char)uVar22;
                        }
                        *(byte *)((long)puVar23 + __n_00) = cVar24 + *pbVar18;
                        puVar23 = (ushort *)((long)puVar23 + 1);
                        pbVar10 = pbVar10 + 1;
                        pbVar18 = pbVar18 + 1;
                        sVar15 = sVar15 - 1;
                      } while (__n_00 != sVar15);
                    }
                    break;
                  case 5:
                    memcpy(src,__src,__n_00);
                    if ((int)uVar3 < (int)uVar14) {
                      lVar11 = 0;
                      do {
                        *(byte *)((long)src + lVar11 + __n_00) =
                             (*(byte *)((long)src + lVar11) >> 1) + raw[lVar11 + lVar1];
                        lVar11 = lVar11 + 1;
                      } while ((__n_00 - __n) + lVar11 != 0);
                    }
                  }
                }
                puVar23 = (ushort *)(psVar8 + (uint)(iVar6 * (int)uVar26));
                __src = __src + __n;
                if (depth < 8) {
                  bVar12 = 1;
                  if (color == 0) {
                    bVar12 = ""[depth];
                  }
                  if (depth == 4) {
                    if (uVar27 != 0) {
                      uVar17 = 0;
                      bVar19 = 0;
                      do {
                        if ((uVar17 & 1) == 0) {
                          bVar19 = (byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar8[uVar17 + uVar29] = (bVar19 >> 4) * bVar12;
                        bVar19 = bVar19 << 4;
                        uVar17 = uVar17 + 1;
                      } while (uVar27 != (uint)uVar17);
                    }
                  }
                  else if (depth == 2) {
                    if (uVar27 != 0) {
                      uVar17 = 0;
                      bVar19 = 0;
                      do {
                        if ((uVar17 & 3) == 0) {
                          bVar19 = (byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar8[uVar17 + uVar29] = (bVar19 >> 6) * bVar12;
                        bVar19 = bVar19 << 2;
                        uVar17 = uVar17 + 1;
                      } while (uVar27 != (uint)uVar17);
                    }
                  }
                  else if (uVar27 != 0) {
                    uVar17 = 0;
                    bVar19 = 0;
                    do {
                      if ((uVar17 & 7) == 0) {
                        bVar19 = (byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar8[uVar17 + uVar29] = (char)bVar19 >> 7 & bVar12;
                      bVar19 = bVar19 * '\x02';
                      uVar17 = uVar17 + 1;
                    } while (uVar27 != (uint)uVar17);
                  }
                  src = puVar23;
                  if (a_00 != out_n) {
LAB_001147d0:
                    stbi__create_png_alpha_expand8((stbi_uc *)puVar23,(stbi_uc *)src,x,a_00);
                  }
                }
                else if (depth == 8) {
                  if (a_00 != out_n) goto LAB_001147d0;
                  memcpy(puVar23,src,(ulong)uVar27);
                }
                else if (depth == 0x10) {
                  if (a_00 == out_n) {
                    if (uVar27 != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar8 + lVar11 * 2 + uVar29) =
                             src[lVar11] << 8 | src[lVar11] >> 8;
                        lVar11 = lVar11 + 1;
                      } while (uVar27 != (uint)lVar11);
                    }
                  }
                  else if (a_00 == 1) {
                    if (x != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar8 + lVar11 * 4 + uVar29) =
                             src[lVar11] << 8 | src[lVar11] >> 8;
                        (psVar8 + lVar11 * 4 + uVar29 + 2)[0] = 0xff;
                        (psVar8 + lVar11 * 4 + uVar29 + 2)[1] = 0xff;
                        lVar11 = lVar11 + 1;
                      } while (x != (stbi__uint32)lVar11);
                    }
                  }
                  else if (x != 0) {
                    lVar11 = 0;
                    do {
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar29) = *src << 8 | *src >> 8;
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar29 + 2) = src[1] << 8 | src[1] >> 8;
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar29 + 4) = src[2] << 8 | src[2] >> 8;
                      (psVar8 + lVar11 * 8 + uVar29 + 6)[0] = 0xff;
                      (psVar8 + lVar11 * 8 + uVar29 + 6)[1] = 0xff;
                      src = src + 3;
                      lVar11 = lVar11 + 1;
                    } while (x != (stbi__uint32)lVar11);
                  }
                }
              }
              else {
                *(char **)(in_FS_OFFSET + -0x20) = "invalid filter";
                bVar5 = 0;
              }
              if (4 < bVar2) break;
              uVar26 = uVar26 + 1;
              bVar20 = bVar20 + 1;
              uVar28 = uVar28 + iVar6;
              raw = __src;
            } while (uVar26 != y);
            uVar14 = (uint)bVar5;
          }
          free(__ptr);
          return uVar14;
        }
        pcVar9 = "outofmem";
      }
      goto LAB_001142d7;
    }
  }
  pcVar9 = "too large";
LAB_001142d7:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar9;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}